

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_egads.c
# Opt level: O0

REF_STATUS ref_egads_tolerance(REF_GEOM ref_geom,REF_INT type,REF_INT id,REF_DBL *tolerance)

{
  REF_DBL *tolerance_local;
  REF_INT id_local;
  REF_INT type_local;
  REF_GEOM ref_geom_local;
  
  *tolerance = -1.0;
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_egads_tolerance(REF_GEOM ref_geom, REF_INT type,
                                       REF_INT id, REF_DBL *tolerance) {
#ifdef HAVE_EGADS
  ego object, *objects;
  double tol;
  int egads_status;

  *tolerance = 0.0;

  object = (ego)NULL;
  switch (type) {
    case REF_GEOM_NODE:
      if (id < 1 || id > ref_geom->nnode) return REF_INVALID;
      objects = (ego *)(ref_geom->nodes);
      object = objects[id - 1];
      break;
    case REF_GEOM_EDGE:
      if (id < 1 || id > ref_geom->nedge) return REF_INVALID;
      objects = (ego *)(ref_geom->edges);
      object = objects[id - 1];
      break;
    case REF_GEOM_FACE:
      if (id < 1 || id > ref_geom->nface) return REF_INVALID;
      objects = (ego *)(ref_geom->faces);
      object = objects[id - 1];
      break;
    case REF_GEOM_BODY:
      object = (ego)(ref_geom->body);
      break;
    default:
      printf("ref_geom type %d unknown\n", type);
      RSS(REF_IMPLEMENT, "unknown surface type");
  }

  egads_status = EG_getTolerance(object, &tol);
  if (EGADS_SUCCESS == egads_status) {
    *tolerance = tol;
  }
  if (EGADS_NOTTOPO == egads_status) {
    /* EFFECTIVE */
    *tolerance = 0.0;
    return REF_SUCCESS;
  }
  REIS(EGADS_SUCCESS, egads_status, "EG tolerance");

#else
  SUPRESS_UNUSED_COMPILER_WARNING(ref_geom);
  SUPRESS_UNUSED_COMPILER_WARNING(type);
  SUPRESS_UNUSED_COMPILER_WARNING(id);
  *tolerance = -1.0;
#endif
  return REF_SUCCESS;
}